

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O3

void * __thiscall
btSortedOverlappingPairCache::removeOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  int *piVar1;
  undefined8 *puVar2;
  btCollisionAlgorithm **ppbVar3;
  btBroadphasePair *pbVar4;
  void *pvVar5;
  btOverlappingPairCallback *pbVar6;
  btBroadphasePair *pbVar7;
  btBroadphaseProxy *pbVar8;
  btCollisionAlgorithm *pbVar9;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar10;
  btBroadphaseProxy *pbVar11;
  btCollisionAlgorithm *pbVar12;
  anon_union_8_2_ea5a2114_for_btBroadphasePair_3 aVar13;
  int iVar14;
  long lVar15;
  btBroadphaseProxy *pbVar16;
  long lVar17;
  int iVar18;
  
  iVar14 = (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
             _vptr_btOverlappingPairCallback[0xe])();
  if ((char)iVar14 == '\0') {
    pbVar16 = proxy0;
    pbVar8 = proxy1;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      pbVar16 = proxy1;
      pbVar8 = proxy0;
    }
    iVar14 = (this->m_overlappingPairArray).m_size;
    if (0 < (long)iVar14) {
      pbVar4 = (this->m_overlappingPairArray).m_data;
      iVar18 = 0;
      lVar17 = 0;
      do {
        if ((*(btBroadphaseProxy **)((long)&pbVar4->m_pProxy0 + lVar17) == pbVar8) &&
           (*(btBroadphaseProxy **)((long)&pbVar4->m_pProxy1 + lVar17) == pbVar16)) {
          if (iVar14 <= iVar18) {
            return (void *)0x0;
          }
          gOverlappingPairs = gOverlappingPairs + -1;
          pvVar5 = *(void **)((long)&pbVar4->field_3 + lVar17);
          (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
            _vptr_btOverlappingPairCallback[8])(this,(long)&pbVar4->m_pProxy0 + lVar17,dispatcher);
          pbVar6 = this->m_ghostPairCallback;
          if (pbVar6 != (btOverlappingPairCallback *)0x0) {
            (*pbVar6->_vptr_btOverlappingPairCallback[3])(pbVar6,proxy0,proxy1,dispatcher);
          }
          lVar15 = (long)(this->m_overlappingPairArray).m_capacity;
          pbVar4 = (this->m_overlappingPairArray).m_data;
          puVar2 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar17);
          pbVar8 = (btBroadphaseProxy *)*puVar2;
          pbVar16 = (btBroadphaseProxy *)puVar2[1];
          puVar2 = (undefined8 *)((long)&pbVar4->m_algorithm + lVar17);
          pbVar9 = (btCollisionAlgorithm *)*puVar2;
          aVar10 = *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(puVar2 + 1);
          pbVar11 = pbVar4[lVar15 + -1].m_pProxy1;
          pbVar12 = pbVar4[lVar15 + -1].m_algorithm;
          aVar13 = *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)
                    (&pbVar4[lVar15 + -1].m_algorithm + 1);
          puVar2 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar17);
          *puVar2 = pbVar4[lVar15 + -1].m_pProxy0;
          puVar2[1] = pbVar11;
          puVar2 = (undefined8 *)((long)&pbVar4->m_algorithm + lVar17);
          *puVar2 = pbVar12;
          *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(puVar2 + 1) = aVar13;
          pbVar7 = (this->m_overlappingPairArray).m_data;
          pbVar4 = pbVar7 + lVar15 + -1;
          pbVar4->m_pProxy0 = pbVar8;
          pbVar4->m_pProxy1 = pbVar16;
          ppbVar3 = &pbVar7[lVar15 + -1].m_algorithm;
          *ppbVar3 = pbVar9;
          *(anon_union_8_2_ea5a2114_for_btBroadphasePair_3 *)(ppbVar3 + 1) = aVar10;
          piVar1 = &(this->m_overlappingPairArray).m_size;
          *piVar1 = *piVar1 + -1;
          return pvVar5;
        }
        lVar17 = lVar17 + 0x20;
        iVar18 = iVar18 + 1;
      } while ((long)iVar14 << 5 != lVar17);
    }
  }
  return (void *)0x0;
}

Assistant:

void*	btSortedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1, btDispatcher* dispatcher )
{
	if (!hasDeferredRemoval())
	{
		btBroadphasePair findPair(*proxy0,*proxy1);

		int findIndex = m_overlappingPairArray.findLinearSearch(findPair);
		if (findIndex < m_overlappingPairArray.size())
		{
			gOverlappingPairs--;
			btBroadphasePair& pair = m_overlappingPairArray[findIndex];
			void* userData = pair.m_internalInfo1;
			cleanOverlappingPair(pair,dispatcher);
			if (m_ghostPairCallback)
				m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);
			
			m_overlappingPairArray.swap(findIndex,m_overlappingPairArray.capacity()-1);
			m_overlappingPairArray.pop_back();
			return userData;
		}
	}

	return 0;
}